

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Tokeniser.h
# Opt level: O1

TokenType __thiscall
soul::
Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>::
parseNumericLiteral(Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                    *this,bool isNegative)

{
  bool bVar1;
  TokenType TVar2;
  anon_class_1_0_00000001 local_51;
  CompileMessage local_50;
  
  bVar1 = parseHexLiteral(this);
  if (bVar1) {
    TVar2 = checkIntLiteralRange(this,isNegative);
    return (TokenType)TVar2.text;
  }
  bVar1 = parseFloatLiteral(this);
  if (bVar1) {
    TVar2.text = (this->literalType).text;
  }
  else {
    bVar1 = parseOctalLiteral(this);
    if (bVar1) {
      CompileMessageHelpers::createMessage<>
                (&local_50,syntax,error,"Octal literals are not supported");
      (*this->_vptr_Tokeniser[2])(this,&local_50);
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_50.location.sourceCode.object);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50.description._M_dataplus._M_p != &local_50.description.field_2) {
        operator_delete(local_50.description._M_dataplus._M_p,
                        local_50.description.field_2._M_allocated_capacity + 1);
      }
    }
    bVar1 = parseBinaryLiteral(this);
    if (!bVar1) {
      local_50.description._M_dataplus._M_p = (this->input).data;
      bVar1 = Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>
              ::
              parseIntegerWithBase<10,soul::Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>::parseDecimalLiteral()::_lambda(unsigned_int)_1_>
                        ((Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>
                          *)this,(UTF8Reader *)&local_50,&local_51);
      if (!bVar1) {
        CompileMessageHelpers::createMessage<>
                  (&local_50,syntax,error,"Syntax error in numeric constant");
        (*this->_vptr_Tokeniser[2])(this,&local_50);
        RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_50.location.sourceCode.object);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50.description._M_dataplus._M_p != &local_50.description.field_2) {
          operator_delete(local_50.description._M_dataplus._M_p,
                          local_50.description.field_2._M_allocated_capacity + 1);
        }
        return (TokenType)(char *)0x0;
      }
    }
    TVar2 = checkIntLiteralRange(this,isNegative);
  }
  return (TokenType)TVar2.text;
}

Assistant:

TokenType parseNumericLiteral (bool isNegative)
    {
        if (parseHexLiteral())      return checkIntLiteralRange (isNegative);
        if (parseFloatLiteral())    return literalType;
        if (parseOctalLiteral())    throwError (Errors::noOctalLiterals());
        if (parseBinaryLiteral())   return checkIntLiteralRange (isNegative);
        if (parseDecimalLiteral())  return checkIntLiteralRange (isNegative);

        throwError (Errors::errorInNumericLiteral());
        return {};
    }